

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_pubkey_save(secp256k1_pubkey *pubkey,secp256k1_ge *ge)

{
  secp256k1_ge *a;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_58;
  
  a = ge;
  secp256k1_ge_verify(ge);
  if (ge->infinity == 0) {
    secp256k1_ge_to_storage(&local_58,ge);
    *(uint64_t *)(pubkey->data + 0x30) = local_58.y.n[2];
    *(uint64_t *)(pubkey->data + 0x38) = local_58.y.n[3];
    *(uint64_t *)(pubkey->data + 0x20) = local_58.y.n[0];
    *(uint64_t *)(pubkey->data + 0x28) = local_58.y.n[1];
    *(uint64_t *)(pubkey->data + 0x10) = local_58.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_58.x.n[3];
    *(uint64_t *)pubkey->data = local_58.x.n[0];
    *(uint64_t *)(pubkey->data + 8) = local_58.x.n[1];
    return;
  }
  secp256k1_pubkey_save_cold_1();
  a->infinity = 0;
  (a->x).magnitude = 0;
  (a->x).normalized = 1;
  (a->x).n[0] = 0;
  (a->x).n[1] = 0;
  (a->x).n[2] = 0;
  (a->x).n[3] = 0;
  (a->x).n[4] = 0;
  secp256k1_fe_verify(&a->x);
  (a->y).magnitude = 0;
  (a->y).normalized = 1;
  (a->y).n[0] = 0;
  (a->y).n[1] = 0;
  (a->y).n[2] = 0;
  (a->y).n[3] = 0;
  (a->y).n[4] = 0;
  secp256k1_fe_verify(&a->y);
  secp256k1_ge_verify(a);
  return;
}

Assistant:

static void secp256k1_pubkey_save(secp256k1_pubkey* pubkey, secp256k1_ge* ge) {
    secp256k1_ge_storage s;

    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(ge));
    secp256k1_ge_to_storage(&s, ge);
    memcpy(&pubkey->data[0], &s, 64);
}